

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O3

void __thiscall Blob_Detection::BlobDetection::sort(BlobDetection *this,BlobCriterion criterion)

{
  pointer pBVar1;
  pointer pBVar2;
  imageException *this_00;
  __normal_iterator<Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
  __i;
  pointer pBVar3;
  
  switch(criterion) {
  case CRITERION_CIRCULARITY:
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar1 != pBVar2) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__0>>
                (pBVar1,pBVar2,(int)LZCOUNT((long)pBVar2 - (long)pBVar1 >> 8) * 2 ^ 0x7e);
      if ((long)pBVar2 - (long)pBVar1 < 0x1001) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__0>>
                  (pBVar1,pBVar2);
        return;
      }
      pBVar3 = pBVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__0>>
                (pBVar1,pBVar3);
      for (; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__0>>
                  (pBVar3);
      }
    }
    break;
  case CRITERION_ELONGATION:
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar1 != pBVar2) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__1>>
                (pBVar1,pBVar2,(int)LZCOUNT((long)pBVar2 - (long)pBVar1 >> 8) * 2 ^ 0x7e);
      if ((long)pBVar2 - (long)pBVar1 < 0x1001) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__1>>
                  (pBVar1,pBVar2);
        return;
      }
      pBVar3 = pBVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__1>>
                (pBVar1,pBVar3);
      for (; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__1>>
                  (pBVar3);
      }
    }
    break;
  case CRITERION_HEIGHT:
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar1 != pBVar2) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__2>>
                (pBVar1,pBVar2,(int)LZCOUNT((long)pBVar2 - (long)pBVar1 >> 8) * 2 ^ 0x7e);
      if ((long)pBVar2 - (long)pBVar1 < 0x1001) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__2>>
                  (pBVar1,pBVar2);
        return;
      }
      pBVar3 = pBVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__2>>
                (pBVar1,pBVar3);
      for (; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__2>>
                  (pBVar3);
      }
    }
    break;
  case CRITERION_LENGTH:
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar1 != pBVar2) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__3>>
                (pBVar1,pBVar2,(int)LZCOUNT((long)pBVar2 - (long)pBVar1 >> 8) * 2 ^ 0x7e);
      if ((long)pBVar2 - (long)pBVar1 < 0x1001) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__3>>
                  (pBVar1,pBVar2);
        return;
      }
      pBVar3 = pBVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__3>>
                (pBVar1,pBVar3);
      for (; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__3>>
                  (pBVar3);
      }
    }
    break;
  case CRITERION_SIZE:
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar1 != pBVar2) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__4>>
                (pBVar1,pBVar2,(int)LZCOUNT((long)pBVar2 - (long)pBVar1 >> 8) * 2 ^ 0x7e);
      if ((long)pBVar2 - (long)pBVar1 < 0x1001) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__4>>
                  (pBVar1,pBVar2);
        return;
      }
      pBVar3 = pBVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__4>>
                (pBVar1,pBVar3);
      for (; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__4>>
                  (pBVar3);
      }
    }
    break;
  case CRITERION_WIDTH:
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar1 != pBVar2) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__5>>
                (pBVar1,pBVar2,(int)LZCOUNT((long)pBVar2 - (long)pBVar1 >> 8) * 2 ^ 0x7e);
      if ((long)pBVar2 - (long)pBVar1 < 0x1001) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__5>>
                  (pBVar1,pBVar2);
        return;
      }
      pBVar3 = pBVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__5>>
                (pBVar1,pBVar3);
      for (; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__5>>
                  (pBVar3);
      }
    }
    break;
  default:
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Bad criterion for blob sorting");
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  return;
}

Assistant:

void BlobDetection::sort( BlobCriterion criterion )
    {
        switch( criterion ) {
            case CRITERION_CIRCULARITY:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.circularity() > blob2.circularity(); } );
                break;
            case CRITERION_ELONGATION:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.elongation() > blob2.elongation(); } );
                break;
            case CRITERION_HEIGHT:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.height() > blob2.height(); } );
                break;
            case CRITERION_LENGTH:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.length() > blob2.length(); } );
                break;
            case CRITERION_SIZE:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.size() > blob2.size(); } );
                break;
            case CRITERION_WIDTH:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.width() > blob2.width(); } );
                break;
            default:
                throw imageException( "Bad criterion for blob sorting" );
        }
    }